

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O0

WirehairCodec
wirehair_encoder_create
          (WirehairCodec reuseOpt,void *message,uint64_t messageBytes,uint32_t blockBytes)

{
  WirehairResult WVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  Codec *in_RDI;
  WirehairResult result;
  Codec *codec;
  Codec *in_stack_ffffffffffffffa0;
  Codec *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Codec *local_30;
  Codec *local_8;
  
  if ((((m_init) && (in_RSI != 0)) && (in_RDX != 0)) && (in_ECX != 0)) {
    local_30 = in_RDI;
    if (in_RDI == (Codec *)0x0) {
      in_stack_ffffffffffffffa0 = (Codec *)operator_new(0x100,(nothrow_t *)&std::nothrow);
      local_30 = (Codec *)0x0;
      in_stack_ffffffffffffffa8 = local_30;
      if (in_stack_ffffffffffffffa0 != (Codec *)0x0) {
        wirehair::Codec::Codec(in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa0;
        local_30 = in_stack_ffffffffffffffa0;
      }
    }
    WVar1 = wirehair::Codec::InitializeEncoder
                      ((Codec *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (uint64_t)in_stack_ffffffffffffffa8,
                       (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if (WVar1 == Wirehair_Success) {
      WVar1 = wirehair::Codec::EncodeFeed(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    if (WVar1 != Wirehair_Success) {
      if (local_30 != (Codec *)0x0) {
        wirehair::Codec::~Codec(in_stack_ffffffffffffffa0);
        operator_delete(local_30);
      }
      local_30 = (Codec *)0x0;
    }
    local_8 = local_30;
  }
  else {
    local_8 = (Codec *)0x0;
  }
  return (WirehairCodec)local_8;
}

Assistant:

WIREHAIR_EXPORT WirehairCodec wirehair_encoder_create(
    WirehairCodec reuseOpt, ///< [Optional] Pointer to prior codec object
    const void*    message, ///< Pointer to message
    uint64_t  messageBytes, ///< Bytes in the message
    uint32_t    blockBytes  ///< Bytes in an output block
)
{
    // If input is invalid:
    if (!m_init || !message || messageBytes < 1 || blockBytes < 1) {
        return nullptr;
    }

    wirehair::Codec* codec = reinterpret_cast<wirehair::Codec*>(reuseOpt);

    // Allocate a new Codec object
    if (!codec) {
        codec = new (std::nothrow) wirehair::Codec;
    }

    // Initialize codec
    WirehairResult result = codec->InitializeEncoder(messageBytes, blockBytes);

    // If initialization succeeded:
    if (result == Wirehair_Success) {
        // Feed message to codec
        result = codec->EncodeFeed(message);
    }

    // If either function failed:
    if (result != Wirehair_Success)
    {
        // Note this will also release the reuse parameter
        delete codec;
        codec = nullptr;
    }

    return reinterpret_cast<WirehairCodec>(codec);
}